

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

string * util::stringTime_abi_cxx11_(void)

{
  size_t sVar1;
  int iVar2;
  runtime_error *prVar3;
  pointer pvVar4;
  size_type sVar5;
  tm *__tp;
  char *__s;
  ulong uVar6;
  string *in_RDI;
  int *in_stack_00000030;
  char (*in_stack_00000038) [2];
  char (*in_stack_00000040) [87];
  char (*in_stack_00000048) [42];
  size_t len;
  array<char,_128UL> tsbuf;
  int rv;
  timespec ts;
  allocator local_106;
  undefined1 local_105;
  undefined4 local_104;
  string local_100 [32];
  size_t local_e0;
  array<char,_128UL> local_d5;
  undefined1 local_55;
  undefined4 local_44;
  string local_40 [36];
  int local_1c;
  timespec local_18;
  
  local_1c = clock_gettime(0,&local_18);
  if (local_1c < 0) {
    local_55 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_44 = 0xc;
    str<char[31],char[87],char[2],int>
              ((char (*) [31])in_stack_00000048,in_stack_00000040,in_stack_00000038,
               in_stack_00000030);
    std::runtime_error::runtime_error(prVar3,local_40);
    local_55 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar4 = std::array<char,_128UL>::data((array<char,_128UL> *)0x1b3708);
  sVar5 = std::array<char,_128UL>::size(&local_d5);
  __tp = gmtime(&local_18.tv_sec);
  local_e0 = strftime(pvVar4,sVar5,"%Y-%m-%dT%H:%M:%S.",__tp);
  pvVar4 = std::array<char,_128UL>::data((array<char,_128UL> *)0x1b375a);
  __s = pvVar4 + local_e0;
  sVar5 = std::array<char,_128UL>::size(&local_d5);
  iVar2 = snprintf(__s,sVar5 - local_e0,"%03ldZ",local_18.tv_nsec / 1000000);
  uVar6 = (long)iVar2 + local_e0;
  local_e0 = uVar6;
  sVar5 = std::array<char,_128UL>::size(&local_d5);
  if (sVar5 <= uVar6) {
    local_105 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_104 = 0x12;
    str<char[42],char[87],char[2],int>
              (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
    std::runtime_error::runtime_error(prVar3,local_100);
    local_105 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar4 = std::array<char,_128UL>::data((array<char,_128UL> *)0x1b38b4);
  sVar1 = local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pvVar4,sVar1,&local_106);
  std::allocator<char>::~allocator((allocator<char> *)&local_106);
  return in_RDI;
}

Assistant:

std::string stringTime() {
  struct timespec ts;
  auto rv = clock_gettime(CLOCK_REALTIME, &ts);
  ASSERT(rv >= 0);
  std::array<char, 128> tsbuf;
  auto len = strftime(
      tsbuf.data(), tsbuf.size(), "%Y-%m-%dT%H:%M:%S.", gmtime(&ts.tv_sec));
  len += snprintf(
      tsbuf.data() + len, tsbuf.size() - len, "%03ldZ", ts.tv_nsec / 1000000);
  ASSERT(len < tsbuf.size());
  return std::string(tsbuf.data(), len);
}